

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureBMP180.cpp
# Opt level: O1

void __thiscall RTPressureBMP180::pressureBackground(RTPressureBMP180 *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint8_t data [2];
  undefined2 local_a;
  
  if (this->m_state == 2) {
    bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                              this->m_pressureAddr,0xf4,'\x01',(uchar *)&local_a,
                              "Failed to read BMP180 pressure conv status");
    if (!bVar1) {
      return;
    }
    if ((local_a & 0x20) != 0) {
      return;
    }
    bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                              this->m_pressureAddr,0xf6,'\x02',(uchar *)&local_a,
                              "Failed to read BMP180 temp conv result");
    if (bVar1) {
      this->m_rawPressure = local_a << 8 | local_a >> 8;
      bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                this->m_pressureAddr,0xf8,'\x01',(uchar *)&local_a,
                                "Failed to read BMP180 XLSB");
      if (bVar1) {
        this->m_state = 0;
        uVar6 = ((uint)this->m_rawTemperature - this->m_AC6) * this->m_AC5 >> 0xf;
        iVar8 = this->m_MD + uVar6;
        if (iVar8 == 0) {
          return;
        }
        bVar5 = (byte)this->m_oss;
        iVar8 = (this->m_MC << 0xb) / iVar8;
        iVar2 = iVar8 + uVar6 + 8;
        iVar3 = iVar8 + uVar6 + 0x17;
        if (-1 < iVar2) {
          iVar3 = iVar2;
        }
        this->m_temperature = (float)(iVar3 >> 4) / 10.0;
        iVar2 = uVar6 + iVar8 + -4000;
        uVar6 = (uint)(iVar2 * iVar2) >> 0xc;
        iVar3 = this->m_B2 * uVar6;
        iVar8 = iVar3 + 0x7ff;
        if (-1 < iVar3) {
          iVar8 = iVar3;
        }
        iVar4 = this->m_AC2 * iVar2;
        iVar3 = iVar4 + 0x7ff;
        if (-1 < iVar4) {
          iVar3 = iVar4;
        }
        iVar3 = (iVar3 >> 0xb) + this->m_AC1 * 4 + (iVar8 >> 0xb) << (bVar5 & 0x1f);
        iVar8 = iVar3 + 2;
        iVar3 = iVar3 + 5;
        if (-1 < iVar8) {
          iVar3 = iVar8;
        }
        iVar2 = iVar2 * this->m_AC3;
        iVar8 = iVar2 + 0x1fff;
        if (-1 < iVar2) {
          iVar8 = iVar2;
        }
        iVar4 = uVar6 * this->m_B1;
        iVar2 = iVar4 + 0xffff;
        if (-1 < iVar4) {
          iVar2 = iVar4;
        }
        iVar4 = (iVar8 >> 0xd) + (iVar2 >> 0x10) + 2;
        iVar8 = (iVar8 >> 0xd) + (iVar2 >> 0x10) + 5;
        if (-1 < iVar4) {
          iVar8 = iVar4;
        }
        uVar7 = (long)((iVar8 >> 2) + 0x8000) * (ulong)this->m_AC4 >> 0xf;
        uVar6 = (50000U >> (bVar5 & 0x1f)) *
                ((uint)(uint3)(CONCAT21(this->m_rawPressure,(uchar)local_a) >> (8 - bVar5 & 0x1f)) -
                (iVar3 >> 2));
        if ((int)uVar6 < 0) {
          iVar8 = (int)((ulong)uVar6 / (uVar7 & 0xffffffff)) * 2;
        }
        else {
          iVar8 = (int)((ulong)(uVar6 * 2) / (uVar7 & 0xffffffff));
        }
        iVar3 = iVar8 + 0xff;
        if (-1 < iVar8) {
          iVar3 = iVar8;
        }
        uVar6 = (uint)((iVar3 >> 8) * (iVar3 >> 8) * 0xbde) >> 0x10;
        iVar2 = iVar8 * -0x1cbd;
        iVar3 = iVar2 + 0xffff;
        if (-1 < iVar2) {
          iVar3 = iVar2;
        }
        iVar2 = (iVar3 >> 0x10) + uVar6 + 0xecf;
        iVar3 = uVar6 + (iVar3 >> 0x10) + 0xede;
        if (-1 < iVar2) {
          iVar3 = iVar2;
        }
        this->m_pressure = (float)((iVar3 >> 4) + iVar8) / 100.0;
        this->m_validReadings = true;
        return;
      }
    }
  }
  else {
    if (this->m_state != 1) {
      return;
    }
    bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                              this->m_pressureAddr,0xf4,'\x01',(uchar *)&local_a,
                              "Failed to read BMP180 temp conv status");
    if (!bVar1) {
      return;
    }
    if ((local_a & 0x20) != 0) {
      return;
    }
    bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                              this->m_pressureAddr,0xf6,'\x02',(uchar *)&local_a,
                              "Failed to read BMP180 temp conv result");
    if (bVar1) {
      this->m_rawTemperature = local_a << 8 | local_a >> 8;
      local_a = CONCAT11(local_a._1_1_,(char)this->m_oss << 6) | 0x34;
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                 this->m_pressureAddr,0xf4,'\x01',(uchar *)&local_a,
                                 "Failed to start pressure conversion");
      if (bVar1) {
        this->m_state = 2;
        return;
      }
    }
  }
  this->m_state = 0;
  return;
}

Assistant:

void RTPressureBMP180::pressureBackground()
{
    uint8_t data[2];

    switch (m_state) {
        case BMP180_STATE_IDLE:
        break;

        case BMP180_STATE_TEMPERATURE:
        if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_SCO, 1, data, "Failed to read BMP180 temp conv status")) {
            break;
        }
        if ((data[0] & 0x20) == 0x20)
            break;                                      // conversion not finished
        if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_RESULT, 2, data, "Failed to read BMP180 temp conv result")) {
            m_state = BMP180_STATE_IDLE;
            break;
        }
        m_rawTemperature = (((uint16_t)data[0]) << 8) + (uint16_t)data[1];

        data[0] = 0x34 + (m_oss << 6);
        if (!m_settings->HALWrite(m_pressureAddr, BMP180_REG_SCO, 1, data, "Failed to start pressure conversion")) {
            m_state = BMP180_STATE_IDLE;
            break;
        }
        m_state = BMP180_STATE_PRESSURE;
        break;

        case BMP180_STATE_PRESSURE:
        if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_SCO, 1, data, "Failed to read BMP180 pressure conv status")) {
            break;
        }
        if ((data[0] & 0x20) == 0x20)
            break;                                      // conversion not finished
        if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_RESULT, 2, data, "Failed to read BMP180 temp conv result")) {
            m_state = BMP180_STATE_IDLE;
            break;
        }
        m_rawPressure = (((uint16_t)data[0]) << 8) + (uint16_t)data[1];

        if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_XLSB, 1, data, "Failed to read BMP180 XLSB")) {
            m_state = BMP180_STATE_IDLE;
            break;
        }

        // call this function for testing only
        // should give T = 150 (15.0C) and pressure 6996 (699.6hPa)

        // setTestData();

        int32_t pressure = ((((uint32_t)(m_rawPressure)) << 8) + (uint32_t)(data[0])) >> (8 - m_oss);

        m_state = BMP180_STATE_IDLE;

        // calculate compensated temperature

        int32_t X1 = (((int32_t)m_rawTemperature - m_AC6) * m_AC5) / 32768;

        if ((X1 + m_MD) == 0) {
            break;
        }

        int32_t X2 = (m_MC * 2048)  / (X1 + m_MD);
        int32_t B5 = X1 + X2;
        m_temperature = (RTFLOAT)((B5 + 8) / 16) / (RTFLOAT)10;

        // calculate compensated pressure

        int32_t B6 = B5 - 4000;
        //          printf("B6 = %d\n", B6);
        X1 = (m_B2 * ((B6 * B6) / 4096)) / 2048;
        //          printf("X1 = %d\n", X1);
        X2 = (m_AC2 * B6) / 2048;
        //          printf("X2 = %d\n", X2);
        int32_t X3 = X1 + X2;
        //          printf("X3 = %d\n", X3);
        int32_t B3 = (((m_AC1 * 4 + X3) << m_oss) + 2) / 4;
        //          printf("B3 = %d\n", B3);
        X1 = (m_AC3 * B6) / 8192;
        //          printf("X1 = %d\n", X1);
        X2 = (m_B1 * ((B6 * B6) / 4096)) / 65536;
        //          printf("X2 = %d\n", X2);
        X3 = ((X1 + X2) + 2) / 4;
        //          printf("X3 = %d\n", X3);
        int32_t B4 = (m_AC4 * (unsigned long)(X3 + 32768)) / 32768;
        //          printf("B4 = %d\n", B4);
        uint32_t B7 = ((unsigned long)pressure - B3) * (50000 >> m_oss);
        //          printf("B7 = %d\n", B7);

        int32_t p;
        if (B7 < 0x80000000)
        p = (B7 * 2) / B4;
            else
        p = (B7 / B4) * 2;

        //          printf("p = %d\n", p);
        X1 = (p / 256) * (p / 256);
        //          printf("X1 = %d\n", X1);
        X1 = (X1 * 3038) / 65536;
        //          printf("X1 = %d\n", X1);
        X2 = (-7357 * p) / 65536;
        //          printf("X2 = %d\n", X2);
        m_pressure = (RTFLOAT)(p + (X1 + X2 + 3791) / 16) / (RTFLOAT)100;      // the extra 100 factor is to get 1hPa units

        m_validReadings = true;

        // printf("UP = %d, P = %f, UT = %d, T = %f\n", m_rawPressure, m_pressure, m_rawTemperature, m_temperature);
        break;
    }
}